

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varintgb.h
# Opt level: O3

void __thiscall
FastPForLib::VarIntGB<false>::encodeArray
          (VarIntGB<false> *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint *puVar4;
  uint *puVar5;
  uint uVar6;
  byte bVar7;
  bool bVar8;
  
  *out = (uint32_t)length;
  puVar5 = out + 1;
  if (length < 4) {
    uVar3 = 0;
  }
  else {
    uVar2 = 3;
    do {
      uVar3 = uVar2;
      *(byte *)puVar5 = 0;
      uVar6 = in[uVar3 - 3];
      if (uVar6 < 0x100) {
        puVar4 = (uint *)((long)puVar5 + 2);
        *(byte *)((long)puVar5 + 1) = (byte)uVar6;
      }
      else if (uVar6 < 0x10000) {
        *(short *)((long)puVar5 + 1) = (short)uVar6;
        puVar4 = (uint *)((long)puVar5 + 3);
        *(byte *)puVar5 = 1;
      }
      else if (uVar6 < 0x1000000) {
        *(byte *)((long)puVar5 + 1) = (byte)uVar6;
        *(byte *)((long)puVar5 + 2) = (byte)(uVar6 >> 8);
        puVar4 = puVar5 + 1;
        *(byte *)((long)puVar5 + 3) = (byte)(uVar6 >> 0x10);
        *(byte *)puVar5 = 2;
      }
      else {
        puVar4 = (uint *)((long)puVar5 + 5);
        *(uint *)((long)puVar5 + 1) = uVar6;
        *(byte *)puVar5 = 3;
      }
      uVar6 = in[uVar3 - 2];
      if (uVar6 < 0x100) {
        *(byte *)puVar4 = (byte)uVar6;
        puVar4 = (uint *)((long)puVar4 + 1);
      }
      else if (uVar6 < 0x10000) {
        *(short *)puVar4 = (short)uVar6;
        *(byte *)puVar5 = (byte)*puVar5 | 4;
        puVar4 = (uint *)((long)puVar4 + 2);
      }
      else if (uVar6 < 0x1000000) {
        *(byte *)puVar4 = (byte)uVar6;
        *(byte *)((long)puVar4 + 1) = (byte)(uVar6 >> 8);
        *(byte *)((long)puVar4 + 2) = (byte)(uVar6 >> 0x10);
        *(byte *)puVar5 = (byte)*puVar5 | 8;
        puVar4 = (uint *)((long)puVar4 + 3);
      }
      else {
        *puVar4 = uVar6;
        *(byte *)puVar5 = (byte)*puVar5 | 0xc;
        puVar4 = puVar4 + 1;
      }
      uVar6 = in[uVar3 - 1];
      if (uVar6 < 0x100) {
        *(byte *)puVar4 = (byte)uVar6;
        puVar4 = (uint *)((long)puVar4 + 1);
      }
      else if (uVar6 < 0x10000) {
        *(short *)puVar4 = (short)uVar6;
        *(byte *)puVar5 = (byte)*puVar5 | 0x10;
        puVar4 = (uint *)((long)puVar4 + 2);
      }
      else if (uVar6 < 0x1000000) {
        *(byte *)puVar4 = (byte)uVar6;
        *(byte *)((long)puVar4 + 1) = (byte)(uVar6 >> 8);
        *(byte *)((long)puVar4 + 2) = (byte)(uVar6 >> 0x10);
        *(byte *)puVar5 = (byte)*puVar5 | 0x20;
        puVar4 = (uint *)((long)puVar4 + 3);
      }
      else {
        *puVar4 = uVar6;
        *(byte *)puVar5 = (byte)*puVar5 | 0x30;
        puVar4 = puVar4 + 1;
      }
      uVar6 = in[uVar3];
      if (uVar6 < 0x100) {
        *(byte *)puVar4 = (byte)uVar6;
        puVar5 = (uint *)((long)puVar4 + 1);
      }
      else if (uVar6 < 0x10000) {
        *(short *)puVar4 = (short)uVar6;
        *(byte *)puVar5 = (byte)*puVar5 | 0x40;
        puVar5 = (uint *)((long)puVar4 + 2);
      }
      else if (uVar6 < 0x1000000) {
        *(byte *)puVar4 = (byte)uVar6;
        *(byte *)((long)puVar4 + 1) = (byte)(uVar6 >> 8);
        *(byte *)((long)puVar4 + 2) = (byte)(uVar6 >> 0x10);
        *(byte *)puVar5 = (byte)*puVar5 | 0x80;
        puVar5 = (uint *)((long)puVar4 + 3);
      }
      else {
        *puVar4 = uVar6;
        *(byte *)puVar5 = (byte)*puVar5 | 0xc0;
        puVar5 = puVar4 + 1;
      }
      uVar2 = uVar3 + 4;
    } while (uVar3 + 4 < length);
    uVar3 = uVar3 + 1;
  }
  puVar4 = puVar5;
  if (uVar3 < length) {
    puVar4 = (uint *)((long)puVar5 + 1);
    *(byte *)puVar5 = 0;
    uVar6 = 0;
    do {
      uVar1 = in[uVar3];
      if (uVar1 < 0x100) {
        *(byte *)puVar4 = (byte)uVar1;
        puVar4 = (uint *)((long)puVar4 + 1);
      }
      else {
        if (uVar1 < 0x10000) {
          *(short *)puVar4 = (short)uVar1;
          puVar4 = (uint *)((long)puVar4 + 2);
          bVar7 = (byte)(1 << (uVar6 & 0x1f));
        }
        else if (uVar1 < 0x1000000) {
          *(byte *)puVar4 = (byte)uVar1;
          *(byte *)((long)puVar4 + 1) = (byte)(uVar1 >> 8);
          bVar7 = (byte)(2 << (uVar6 & 0x1f));
          *(byte *)((long)puVar4 + 2) = (byte)(uVar1 >> 0x10);
          puVar4 = (uint *)((long)puVar4 + 3);
        }
        else {
          *puVar4 = uVar1;
          puVar4 = puVar4 + 1;
          bVar7 = (byte)(3 << (uVar6 & 0x1f));
        }
        *(byte *)puVar5 = (byte)*puVar5 | bVar7;
      }
    } while ((uVar3 + 1 < length) &&
            (bVar8 = uVar6 < 6, uVar3 = uVar3 + 1, uVar6 = uVar6 + 2, bVar8));
  }
  if (((ulong)puVar4 & 3) != 0) {
    uVar3 = (ulong)((uint)puVar4 & 3);
    memset(puVar4,0,4 - uVar3);
    puVar4 = (uint *)((uVar3 ^ 3) + 1 + (long)puVar4);
  }
  *nvalue = (ulong)((long)puVar4 - (long)out) >> 2;
  return;
}

Assistant:

void encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                   size_t &nvalue) {
    uint32_t prev = 0; // for delta

    uint8_t *bout = reinterpret_cast<uint8_t *>(out);
    const uint8_t *const initbout = reinterpret_cast<uint8_t *>(out);
    *out = static_cast<uint32_t>(length);
    bout += 4;

    size_t k = 0;
    for (; k + 3 < length; k += 4) {
      uint8_t *keyp = bout++;
      *keyp = 0;
      {
        const uint32_t val = delta ? in[k] - prev : in[k];
        if (delta)
          prev = in[k];
        if (val < (1U << 8)) {
          *bout++ = static_cast<uint8_t>(val);
        } else if (val < (1U << 16)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *keyp = static_cast<uint8_t>(1);
        } else if (val < (1U << 24)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *bout++ = static_cast<uint8_t>(val >> 16);
          *keyp = static_cast<uint8_t>(2);
        } else {
          // the compiler will do the right thing
          *reinterpret_cast<uint32_t *>(bout) = val;
          bout += 4;
          *keyp = static_cast<uint8_t>(3);
        }
      }
      {
        const uint32_t val = delta ? in[k + 1] - prev : in[k + 1];
        if (delta)
          prev = in[k + 1];
        if (val < (1U << 8)) {
          *bout++ = static_cast<uint8_t>(val);
        } else if (val < (1U << 16)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *keyp |= static_cast<uint8_t>(1 << 2);
        } else if (val < (1U << 24)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *bout++ = static_cast<uint8_t>(val >> 16);
          *keyp |= static_cast<uint8_t>(2 << 2);
        } else {
          // the compiler will do the right thing
          *reinterpret_cast<uint32_t *>(bout) = val;
          bout += 4;
          *keyp |= static_cast<uint8_t>(3 << 2);
        }
      }
      {
        const uint32_t val = delta ? in[k + 2] - prev : in[k + 2];
        if (delta)
          prev = in[k + 2];
        if (val < (1U << 8)) {
          *bout++ = static_cast<uint8_t>(val);
        } else if (val < (1U << 16)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *keyp |= static_cast<uint8_t>(1 << 4);
        } else if (val < (1U << 24)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *bout++ = static_cast<uint8_t>(val >> 16);
          *keyp |= static_cast<uint8_t>(2 << 4);
        } else {
          // the compiler will do the right thing
          *reinterpret_cast<uint32_t *>(bout) = val;
          bout += 4;
          *keyp |= static_cast<uint8_t>(3 << 4);
        }
      }
      {
        const uint32_t val = delta ? in[k + 3] - prev : in[k + 3];
        if (delta)
          prev = in[k + 3];
        if (val < (1U << 8)) {
          *bout++ = static_cast<uint8_t>(val);
        } else if (val < (1U << 16)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *keyp |= static_cast<uint8_t>(1 << 6);
        } else if (val < (1U << 24)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *bout++ = static_cast<uint8_t>(val >> 16);
          *keyp |= static_cast<uint8_t>(2 << 6);
        } else {
          // the compiler will do the right thing
          *reinterpret_cast<uint32_t *>(bout) = val;
          bout += 4;
          *keyp |= static_cast<uint8_t>(3 << 6);
        }
      }
    }

    if (k < length) {
      uint8_t *keyp = bout++;
      *keyp = 0;
      for (int j = 0; k < length && j < 8; j += 2, ++k) {
        const uint32_t val = delta ? in[k] - prev : in[k];
        if (delta)
          prev = in[k];
        if (val < (1U << 8)) {
          *bout++ = static_cast<uint8_t>(val);
        } else if (val < (1U << 16)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *keyp |= static_cast<uint8_t>(1 << j);
        } else if (val < (1U << 24)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *bout++ = static_cast<uint8_t>(val >> 16);
          *keyp |= static_cast<uint8_t>(2 << j);
        } else {
          // the compiler will do the right thing
          *reinterpret_cast<uint32_t *>(bout) = val;
          bout += 4;
          *keyp |= static_cast<uint8_t>(3 << j);
        }
      }
    }
    while (needPaddingTo32Bits(bout)) {
      *bout++ = 0;
    }
    const size_t storageinbytes = bout - initbout;
    assert((storageinbytes % 4) == 0);
    nvalue = storageinbytes / 4;
  }